

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nsync_panic.c
# Opt level: O1

void writestr(int fd,char *s)

{
  uint uVar1;
  size_t sVar2;
  ssize_t sVar3;
  int *piVar4;
  char *__s;
  undefined4 in_register_0000003c;
  bool bVar5;
  
  __s = (char *)CONCAT44(in_register_0000003c,fd);
  sVar2 = strlen(__s);
  if ((int)sVar2 != 0) {
    do {
      sVar3 = write(2,__s,(long)(int)sVar2);
      uVar1 = (uint)sVar3;
      if ((int)uVar1 < 0) {
        if (uVar1 == 0xffffffff) {
          piVar4 = __errno_location();
          bVar5 = *piVar4 == 4;
        }
        else {
          bVar5 = false;
        }
      }
      else {
        sVar2 = (size_t)((int)sVar2 - uVar1);
        __s = __s + (uVar1 & 0x7fffffff);
        bVar5 = true;
      }
    } while (((int)sVar2 != 0) && (bVar5));
  }
  return;
}

Assistant:

NSYNC_CPP_START_

/* Write the nul-terminated string s[] to file descriptor fd. */
static void writestr (int fd, const char *s) {
        int len = strlen (s);
        int n = 0;
        while (len != 0 && n >= 0) {
                n = write (fd, s, len);
                if (n >= 0) {
                        len -= n;
                        s += n;
                } else if (n == -1 && errno == EINTR) {
                        n = 0;
                }
        }
}